

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  hbtrie *phVar1;
  long lVar2;
  undefined8 *puVar3;
  bid_t bVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  bool bVar7;
  file_status_t fVar8;
  hbtrie_result hVar9;
  fdb_status fVar10;
  undefined8 *puVar11;
  err_log_callback *log_callback;
  fdb_config *in_stack_00001ae0;
  fdb_filename_mode_t in_stack_00001aec;
  char *in_stack_00001af0;
  fdb_kvs_handle *in_stack_00001af8;
  uint in_stack_fffffffffffffe5c;
  uint8_t initial;
  filemgr *pfStack_1a0;
  hbtrie_result hr;
  uint8_t *_kv_id;
  bid_t dummy;
  bid_t seq_root;
  bid_t id_root;
  size_t size_id;
  size_t size_chunk;
  file_status_t fstatus;
  char *pcStack_168;
  uint sleep_time;
  char *kvs_name;
  fdb_file_handle *fhandle;
  fdb_seqnum_t old_seqnum;
  fdb_kvs_handle *pfStack_148;
  fdb_status fs;
  fdb_kvs_handle *super_handle;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *handle_in;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_seqnum_t seqnum_local;
  fdb_kvs_handle **handle_ptr_local;
  
  if (handle_ptr == (fdb_kvs_handle **)0x0) {
    handle_ptr_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle = *handle_ptr;
    if (handle == (fdb_kvs_handle *)0x0) {
      handle_ptr_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
    }
    else if (handle->kvs == (kvs_info *)0x0) {
      handle_ptr_local._4_4_ = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pfStack_148 = handle->kvs->root;
      kvs_name = (char *)handle->fhandle;
      memcpy(&kvs_config.custom_cmp_param,&handle->config,0xf8);
      handle_in = *(fdb_kvs_handle **)&handle->kvs_config;
      kvs_config._0_8_ = (handle->kvs_config).custom_cmp;
      kvs_config.custom_cmp = (fdb_custom_cmp_variable)(handle->kvs_config).custom_cmp_param;
      if (((handle->config).flags & 2) == 0) {
        filemgr_mutex_lock((filemgr *)0x183215);
        filemgr_set_rollback(pfStack_1a0,(uint8_t)(in_stack_fffffffffffffe5c >> 0x18));
        bVar7 = wal_txn_exists((filemgr *)_kv_id);
        if (bVar7) {
          filemgr_set_rollback(pfStack_1a0,(uint8_t)(in_stack_fffffffffffffe5c >> 0x18));
          filemgr_mutex_unlock((filemgr *)0x183262);
          handle_ptr_local._4_4_ = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          size_chunk._4_4_ = 10000;
          fVar8 = filemgr_get_file_status((filemgr *)0x183288);
          size_chunk._0_4_ = CONCAT13(fVar8,(undefined3)size_chunk);
          while (size_chunk._3_1_ == '\x01') {
            filemgr_mutex_unlock((filemgr *)0x1832aa);
            decaying_usleep((uint *)pfStack_1a0,in_stack_fffffffffffffe5c);
            filemgr_mutex_lock((filemgr *)0x1832cb);
            fVar8 = filemgr_get_file_status((filemgr *)0x1832db);
            size_chunk._0_4_ = CONCAT13(fVar8,(undefined3)size_chunk);
          }
          if (size_chunk._3_1_ == '\x04') {
            filemgr_mutex_unlock((filemgr *)0x1832ff);
            initial = (uint8_t)(in_stack_fffffffffffffe5c >> 0x18);
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          else {
            filemgr_mutex_unlock((filemgr *)0x183321);
            initial = (uint8_t)(in_stack_fffffffffffffe5c >> 0x18);
          }
          fdb_sync_db_header((fdb_kvs_handle *)
                             CONCAT71(config._25_7_,config.wal_flush_before_commit));
          if (handle->seqnum < seqnum) {
            filemgr_set_rollback(pfStack_1a0,initial);
            handle_ptr_local._4_4_ = FDB_RESULT_NO_DB_INSTANCE;
          }
          else {
            pcStack_168 = _fdb_kvs_get_name((fdb_kvs_handle *)config.prefetch_duration,
                                            (filemgr *)config._64_8_);
            if (seqnum == 0) {
              old_seqnum._4_4_ = _fdb_kvs_remove((fdb_file_handle *)kvs_name,pcStack_168,true);
              filemgr_set_rollback(pfStack_1a0,initial);
              handle_ptr_local._4_4_ = old_seqnum._4_4_;
            }
            else {
              super_handle = (fdb_kvs_handle *)calloc(1,0x208);
              if (super_handle == (fdb_kvs_handle *)0x0) {
                filemgr_set_rollback(pfStack_1a0,initial);
                handle_ptr_local._4_4_ = FDB_RESULT_ALLOC_FAIL;
              }
              else {
                super_handle->max_seqnum = seqnum;
                (super_handle->log_callback).callback = (handle->log_callback).callback;
                (super_handle->log_callback).callback_ex = (handle->log_callback).callback_ex;
                (super_handle->log_callback).ctx_data = (handle->log_callback).ctx_data;
                super_handle->fhandle = (fdb_file_handle *)kvs_name;
                atomic_init_uint8_t((atomic<unsigned_char> *)pfStack_1a0,initial);
                if (handle->kvs->type == '\x01') {
                  old_seqnum._4_4_ =
                       _fdb_kvs_open(pfStack_148,
                                     (fdb_config *)CONCAT44(old_seqnum._4_4_,(undefined4)old_seqnum)
                                     ,(fdb_kvs_config *)fhandle,(filemgr *)kvs_name,pcStack_168,
                                     (char *)CONCAT44(size_chunk._4_4_,(undefined4)size_chunk),
                                     handle_in);
                }
                else {
                  old_seqnum._4_4_ =
                       _fdb_open(in_stack_00001af8,in_stack_00001af0,in_stack_00001aec,
                                 in_stack_00001ae0);
                }
                filemgr_set_rollback(pfStack_1a0,initial);
                if (old_seqnum._4_4_ == FDB_RESULT_SUCCESS) {
                  size_id = (size_t)super_handle->trie->chunksize;
                  id_root = 8;
                  filemgr_mutex_lock((filemgr *)0x18355c);
                  lVar2 = -(size_id + 0xf & 0xfffffffffffffff0);
                  puVar11 = (undefined8 *)(&stack0xfffffffffffffe58 + lVar2);
                  pfStack_1a0 = (filemgr *)puVar11;
                  *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x18359d;
                  kvid2buf(*(size_t *)((long)&dummy + lVar2),
                           *(fdb_kvs_id_t *)((long)&_kv_id + lVar2),
                           *(void **)((long)&stack0xfffffffffffffe60 + lVar2));
                  sVar5 = size_id;
                  puVar3 = &pfStack_1a0->filename;
                  phVar1 = super_handle->trie;
                  *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x1835c4;
                  hVar9 = hbtrie_find_partial(phVar1,puVar3,(int)sVar5,&seq_root);
                  *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x1835da;
                  btreeblk_end(*(btreeblk_handle **)((long)&_kv_id + lVar2));
                  if (hVar9 == HBTRIE_RESULT_SUCCESS) {
                    *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x183611;
                    hbtrie_insert_partial
                              (*(hbtrie **)((long)&dummy + lVar2),*(void **)((long)&_kv_id + lVar2),
                               *(int *)((long)&hr + lVar2),(void *)*puVar11,
                               *(void **)(&stack0xfffffffffffffe50 + lVar2));
                  }
                  else {
                    *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x183633;
                    hbtrie_remove_partial
                              (*(hbtrie **)((long)&stack0xfffffffffffffe60 + lVar2),(void *)*puVar11
                               ,*(int *)(&stack0xfffffffffffffe54 + lVar2));
                  }
                  *(undefined8 *)(&stack0xfffffffffffffe50 + lVar2) = 0x183643;
                  btreeblk_end(*(btreeblk_handle **)((long)&_kv_id + lVar2));
                  if (config.wal_flush_before_commit) {
                    puVar11 = (undefined8 *)((long)puVar11 - (id_root + 0xf & 0xfffffffffffffff0));
                    pfStack_1a0 = (filemgr *)puVar11;
                    puVar11[-1] = 0x183694;
                    kvid2buf(puVar11[3],puVar11[2],(void *)puVar11[1]);
                    bVar4 = id_root;
                    puVar3 = &pfStack_1a0->filename;
                    phVar1 = (super_handle->field_6).seqtrie;
                    puVar11[-1] = 0x1836bb;
                    hVar9 = hbtrie_find_partial(phVar1,puVar3,(int)bVar4,&dummy);
                    puVar11[-1] = 0x1836d1;
                    btreeblk_end((btreeblk_handle *)puVar11[2]);
                    if (hVar9 == HBTRIE_RESULT_SUCCESS) {
                      puVar11[-1] = 0x183708;
                      hbtrie_insert_partial
                                ((hbtrie *)puVar11[3],(void *)puVar11[2],
                                 *(int *)((long)puVar11 + 0xc),(void *)*puVar11,(void *)puVar11[-1])
                      ;
                    }
                    else {
                      puVar11[-1] = 0x18372a;
                      hbtrie_remove_partial
                                ((hbtrie *)puVar11[1],(void *)*puVar11,*(int *)((long)puVar11 + -4))
                      ;
                    }
                    puVar11[-1] = 0x18373a;
                    btreeblk_end((btreeblk_handle *)puVar11[2]);
                  }
                  puVar11[-1] = 0x183759;
                  fhandle = (fdb_file_handle *)fdb_kvs_get_seqnum((filemgr *)*puVar11,puVar11[-1]);
                  puVar11[-1] = 0x183783;
                  fdb_kvs_set_seqnum((filemgr *)puVar11[0x1f],puVar11[0x1e],puVar11[0x1d]);
                  handle->seqnum = seqnum;
                  puVar11[-1] = 0x1837a5;
                  filemgr_mutex_unlock((filemgr *)puVar11[-1]);
                  pfStack_148->rollback_revnum = super_handle->rollback_revnum;
                  puVar11[-1] = 0x1837f1;
                  fVar10 = _fdb_commit((fdb_kvs_handle *)puVar11[0x1a],
                                       *(fdb_commit_opt_t *)((long)puVar11 + 0xcf),
                                       *(bool *)((long)puVar11 + 0xce));
                  old_seqnum._4_4_ = fVar10;
                  if (fVar10 == FDB_RESULT_SUCCESS) {
                    puVar11[-1] = 0x18380c;
                    _fdb_kvs_close((fdb_kvs_handle *)puVar11[1]);
                    *handle_ptr = handle;
                    puVar11[-1] = 0x183826;
                    fdb_kvs_info_free((fdb_kvs_handle *)puVar11[-1]);
                    pfVar6 = super_handle;
                    puVar11[-1] = 0x183832;
                    free(pfVar6);
                  }
                  else {
                    log_callback = &handle->log_callback;
                    puVar11[-2] = 
                    "Rollback failed due to a commit failure with a sequence number %lu";
                    puVar11[-1] = seqnum;
                    puVar11[-3] = 0x183883;
                    fdb_log_impl(log_callback,2,(fdb_status)(ulong)(uint)fVar10,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                                 ,"fdb_kvs_rollback",0x921);
                    puVar11[-1] = 0x183897;
                    filemgr_mutex_lock((filemgr *)puVar11[-1]);
                    puVar11[-1] = 0x1838bd;
                    fdb_kvs_set_seqnum((filemgr *)puVar11[0x1f],puVar11[0x1e],puVar11[0x1d]);
                    puVar11[-1] = 0x1838cd;
                    filemgr_mutex_unlock((filemgr *)puVar11[-1]);
                    puVar11[-1] = 0x1838d9;
                    _fdb_kvs_close((fdb_kvs_handle *)puVar11[1]);
                    puVar11[-1] = 0x1838e5;
                    fdb_kvs_info_free((fdb_kvs_handle *)puVar11[-1]);
                    pfVar6 = super_handle;
                    puVar11[-1] = 0x1838f1;
                    free(pfVar6);
                  }
                }
                else {
                  free(super_handle);
                }
                handle_ptr_local._4_4_ = old_seqnum._4_4_;
              }
            }
          }
        }
      }
      else {
        handle_ptr_local._4_4_ =
             fdb_log_impl(&handle->log_callback,2,FDB_RESULT_RONLY_VIOLATION,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                          ,"fdb_kvs_rollback",0x895,
                          "Warning: Rollback is not allowed on the read-only DB file \'%s\'.");
      }
    }
  }
  return handle_ptr_local._4_4_;
}

Assistant:

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_handle *handle_in, *handle, *super_handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;
    fdb_file_handle *fhandle;
    char *kvs_name;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle_in->kvs) {
        return FDB_RESULT_INVALID_ARGS;
    }
    super_handle = handle_in->kvs->root;
    fhandle = handle_in->fhandle;
    config = handle_in->config;
    kvs_config = handle_in->kvs_config;

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on "
                       "the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    kvs_name = _fdb_kvs_get_name(handle_in, handle_in->file);
    if (seqnum == 0) { // Handle special case of rollback to zero..
        fs = _fdb_kvs_remove(fhandle, kvs_name, true /*recreate!*/);
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return fs;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle->max_seqnum = seqnum;
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = fhandle;
    atomic_init_uint8_t(&handle->handle_busy, 0);

    if (handle_in->kvs->type == KVS_SUB) {
        fs = _fdb_kvs_open(handle_in->kvs->root,
                           &config,
                           &kvs_config,
                           handle_in->file,
                           handle_in->file->filename,
                           kvs_name,
                           handle);
    } else {
        fs = _fdb_open(handle, handle_in->file->filename,
                       FDB_AFILENAME, &config);
    }
    filemgr_set_rollback(handle_in->file, 0); // allow mutations

    if (fs == FDB_RESULT_SUCCESS) {
        // get KV instance's sub B+trees' root node BIDs
        // from both ID-tree and Seq-tree, AND
        // replace current handle's sub B+trees' root node BIDs
        // by old BIDs
        size_t size_chunk, size_id;
        bid_t id_root, seq_root, dummy;
        uint8_t *_kv_id;
        hbtrie_result hr;

        size_chunk = handle->trie->chunksize;
        size_id = sizeof(fdb_kvs_id_t);

        filemgr_mutex_lock(handle_in->file);

        // read root BID of the KV instance from the old handle
        // and overwrite into the current handle
        _kv_id = alca(uint8_t, size_chunk);
        kvid2buf(size_chunk, handle->kvs->id, _kv_id);
        hr = hbtrie_find_partial(handle->trie, _kv_id,
                                 size_chunk, &id_root);
        btreeblk_end(handle->bhandle);
        if (hr == HBTRIE_RESULT_SUCCESS) {
            hbtrie_insert_partial(super_handle->trie,
                                  _kv_id, size_chunk,
                                  &id_root, &dummy);
        } else { // No Trie info in rollback header.
                 // Erase kv store from super handle's main index.
            hbtrie_remove_partial(super_handle->trie, _kv_id, size_chunk);
        }
        btreeblk_end(super_handle->bhandle);

        if (config.seqtree_opt == FDB_SEQTREE_USE) {
            // same as above for seq-trie
            _kv_id = alca(uint8_t, size_id);
            kvid2buf(size_id, handle->kvs->id, _kv_id);
            hr = hbtrie_find_partial(handle->seqtrie, _kv_id,
                                     size_id, &seq_root);
            btreeblk_end(handle->bhandle);
            if (hr == HBTRIE_RESULT_SUCCESS) {
                hbtrie_insert_partial(super_handle->seqtrie,
                                      _kv_id, size_id,
                                      &seq_root, &dummy);
            } else { // No seqtrie info in rollback header.
                     // Erase kv store from super handle's seqtrie index.
                hbtrie_remove_partial(super_handle->seqtrie, _kv_id, size_id);
            }
            btreeblk_end(super_handle->bhandle);
        }

        old_seqnum = fdb_kvs_get_seqnum(handle_in->file,
                                        handle_in->kvs->id);
        fdb_kvs_set_seqnum(handle_in->file,
                           handle_in->kvs->id, seqnum);
        handle_in->seqnum = seqnum;
        filemgr_mutex_unlock(handle_in->file);

        super_handle->rollback_revnum = handle->rollback_revnum;
        fs = _fdb_commit(super_handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                         !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_kvs_close(handle);
            *handle_ptr = handle_in;
            fdb_kvs_info_free(handle);
            free(handle);
        } else {
            // cancel the rolling-back of the sequence number
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Rollback failed due to a commit failure with a sequence "
                    "number %" _F64, seqnum);
            filemgr_mutex_lock(handle_in->file);
            fdb_kvs_set_seqnum(handle_in->file,
                               handle_in->kvs->id, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            _fdb_kvs_close(handle);
            fdb_kvs_info_free(handle);
            free(handle);
        }
    } else {
        free(handle);
    }

    return fs;
}